

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

void stbiw__write_pixel(stbi__write_context *s,int rgb_dir,int comp,int write_alpha,int expand_mono,
                       uchar *d)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  void *pvVar6;
  undefined4 in_register_00000084;
  char *pcVar7;
  uchar px [3];
  uchar arr [3];
  char local_2c [4];
  char local_28;
  char local_27;
  char local_26 [6];
  
  pcVar7 = (char *)CONCAT44(in_register_00000084,expand_mono);
  switch(rgb_dir) {
  case 1:
switchD_0010f813_caseD_1:
    pvVar6 = s->context;
    iVar4 = 1;
    pcVar5 = pcVar7;
    goto LAB_0010f85e;
  case 2:
    if (write_alpha == 0) goto switchD_0010f813_caseD_1;
    local_2c[3] = *pcVar7;
    pcVar5 = local_2c + 3;
    local_28 = local_2c[3];
    local_27 = local_2c[3];
    goto LAB_0010f855;
  case 3:
switchD_0010f813_caseD_3:
    local_2c[2] = pcVar7[2];
    local_2c[0] = *pcVar7;
    local_2c[1] = pcVar7[1];
    pcVar5 = local_26 + 3;
    break;
  case 4:
    if (comp != 0) goto switchD_0010f813_caseD_3;
    bVar1 = pcVar7[3];
    lVar3 = 0;
    do {
      lVar2 = (long)(int)(((uint)(byte)pcVar7[lVar3] - (uint)(byte)(&DAT_001241bc)[lVar3]) *
                         (uint)bVar1) * 0x80808081;
      local_2c[lVar3] =
           ((char)(uint)((ulong)lVar2 >> 0x27) - (char)(lVar2 >> 0x3f)) + (&DAT_001241bc)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    pcVar5 = local_26;
    break;
  default:
    goto switchD_0010f813_default;
  }
  *pcVar5 = local_2c[2];
  pcVar5[1] = local_2c[1];
  pcVar5[2] = local_2c[0];
LAB_0010f855:
  pvVar6 = s->context;
  iVar4 = 3;
LAB_0010f85e:
  (*s->func)(pvVar6,pcVar5,iVar4);
switchD_0010f813_default:
  if (0 < comp) {
    (*s->func)(s->context,pcVar7 + (long)rgb_dir + -1,1);
  }
  return;
}

Assistant:

static void stbiw__write_pixel(stbi__write_context *s, int rgb_dir, int comp, int write_alpha, int expand_mono, unsigned char *d)
{
   unsigned char bg[3] = { 255, 0, 255}, px[3];
   int k;

   if (write_alpha < 0)
      s->func(s->context, &d[comp - 1], 1);

   switch (comp) {
      case 1:
         s->func(s->context,d,1);
         break;
      case 2:
         if (expand_mono)
            stbiw__write3(s, d[0], d[0], d[0]); // monochrome bmp
         else
            s->func(s->context, d, 1);  // monochrome TGA
         break;
      case 4:
         if (!write_alpha) {
            // composite against pink background
            for (k = 0; k < 3; ++k)
               px[k] = bg[k] + ((d[k] - bg[k]) * d[3]) / 255;
            stbiw__write3(s, px[1 - rgb_dir], px[1], px[1 + rgb_dir]);
            break;
         }
         /* FALLTHROUGH */
      case 3:
         stbiw__write3(s, d[1 - rgb_dir], d[1], d[1 + rgb_dir]);
         break;
   }
   if (write_alpha > 0)
      s->func(s->context, &d[comp - 1], 1);
}